

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::setMinimumFractionDigits(DecimalFormat *this,int32_t newValue)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->minimumFractionDigits != newValue) {
    if (pDVar1->maximumFractionDigits < newValue && -1 < pDVar1->maximumFractionDigits) {
      pDVar1->maximumFractionDigits = newValue;
    }
    pDVar1->minimumFractionDigits = newValue;
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setMinimumFractionDigits(int32_t newValue) {
    if (newValue == fields->properties->minimumFractionDigits) { return; }
    // For backwards compatibility, conflicting min/max need to keep the most recent setting.
    int32_t max = fields->properties->maximumFractionDigits;
    if (max >= 0 && max < newValue) {
        fields->properties->maximumFractionDigits = newValue;
    }
    fields->properties->minimumFractionDigits = newValue;
    touchNoError();
}